

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

void __thiscall String::String(String *this,String *other)

{
  usize uVar1;
  Data *pDVar2;
  ulong uVar3;
  
  pDVar2 = other->data;
  if (pDVar2->ref == 0) {
    if (pDVar2 == &emptyData.super_Data) {
      this->data = &emptyData.super_Data;
    }
    else {
      uVar3 = pDVar2->len | 3;
      pDVar2 = (Data *)operator_new__(uVar3 + 0x21);
      this->data = pDVar2;
      pDVar2->str = (char *)(pDVar2 + 1);
      Memory::copy((Memory *)(pDVar2 + 1),(EVP_PKEY_CTX *)other->data->str,
                   (EVP_PKEY_CTX *)other->data->len);
      pDVar2 = this->data;
      uVar1 = other->data->len;
      pDVar2->len = uVar1;
      pDVar2->str[uVar1] = '\0';
      pDVar2 = this->data;
      pDVar2->ref = 1;
      pDVar2->capacity = uVar3;
    }
  }
  else {
    this->data = pDVar2;
    LOCK();
    pDVar2->ref = pDVar2->ref + 1;
    UNLOCK();
  }
  return;
}

Assistant:

String(const String& other)
  {
    if(other.data->ref)
    {
      data = other.data;
      Atomic::increment(data->ref);
    }
    else if(other.data == &emptyData)
      data = &emptyData;
    else
    {
      usize capacity = other.data->len | 0x3;
      data = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
      data->str = (char*)((byte*)data + sizeof(Data));
      Memory::copy((char*)data->str, other.data->str, other.data->len * sizeof(char));
      ((char*)data->str)[data->len = other.data->len] = '\0';
      data->ref = 1;
      data->capacity = capacity;
    }
  }